

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::NumericCharacterEntity
          (NumericCharacterEntity *this,vector<char,_std::allocator<char>_> *encodings)

{
  bool bVar1;
  reference pcVar2;
  iterator iStack_40;
  char c;
  iterator __end2;
  iterator __begin2;
  vector<char,_std::allocator<char>_> *__range2;
  vector<char,_std::allocator<char>_> *encodings_local;
  NumericCharacterEntity *this_local;
  
  std::
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->encodings_table_);
  AddCharacterEncoding(this,'&');
  __end2 = std::vector<char,_std::allocator<char>_>::begin(encodings);
  iStack_40 = std::vector<char,_std::allocator<char>_>::end(encodings);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&__end2);
    AddCharacterEncoding(this,*pcVar2);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&__end2);
  }
  return;
}

Assistant:

SubjectFormatter::NumericCharacterEntity::NumericCharacterEntity(std::vector<char> encodings)
{
    AddCharacterEncoding('&');

    for (char c : encodings)
    {
        AddCharacterEncoding(c);
    }
}